

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureBase.cpp
# Opt level: O2

void Diligent::ValidatePipelineResourceSignatureDesc
               (PipelineResourceSignatureDesc *Desc,IRenderDevice *pDevice,
               RENDER_DEVICE_TYPE DeviceType)

{
  char **ppcVar1;
  SHADER_TYPE SVar2;
  char **Args_4;
  SHADER_TYPE *pSVar3;
  PIPELINE_RESOURCE_FLAGS PVar4;
  PIPELINE_RESOURCE_FLAGS PVar5;
  SHADER_RESOURCE_TYPE SVar6;
  int iVar7;
  uint uVar8;
  SHADER_TYPE SVar9;
  undefined4 extraout_var;
  _Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
  _Var11;
  char *pcVar12;
  _Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
  _Var13;
  ulong uVar14;
  _Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
  _Var15;
  char (*pacVar16) [51];
  PipelineResourceSignatureDesc *Args_4_00;
  SHADER_TYPE SVar17;
  SHADER_TYPE extraout_EDX;
  SHADER_TYPE ShaderStages;
  SHADER_TYPE extraout_EDX_00;
  SHADER_TYPE extraout_EDX_01;
  SHADER_TYPE extraout_EDX_02;
  SHADER_TYPE extraout_EDX_03;
  SHADER_TYPE extraout_EDX_04;
  SHADER_TYPE extraout_EDX_05;
  SHADER_TYPE ShaderStages_00;
  SHADER_TYPE extraout_EDX_06;
  SHADER_TYPE extraout_EDX_07;
  SHADER_TYPE extraout_EDX_08;
  SHADER_TYPE ShaderStages_01;
  SHADER_TYPE extraout_EDX_09;
  SHADER_TYPE extraout_EDX_10;
  SHADER_TYPE ShaderStages_02;
  SHADER_TYPE ShaderStages_03;
  SHADER_TYPE ShaderStages_04;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 uVar18;
  ulong uVar19;
  Char **Args_4_01;
  char *in_R8;
  PipelineResourceDesc *pPVar20;
  _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false,_false>
  sam_it;
  ImmutableSamplerDesc *pIVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false,_false>_>
  pVar26;
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false,_false>_>
  pVar27;
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false,_false>_>
  pVar28;
  PipelineResourceSignatureDesc *pPVar29;
  string msg_3;
  String AssignedSamplerName;
  char *local_138;
  unordered_multimap<Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>_>_>
  ImtblSamplers;
  string msg;
  __node_base_ptr p_Stack_c8;
  String local_c0;
  unordered_multimap<Diligent::HashMapStringKey,_Diligent::SHADER_TYPE,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>_>_>
  AssignedImtblSamplers;
  unordered_multimap<Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>_>_>
  Resources;
  RENDER_DEVICE_TYPE *pRVar10;
  
  if (pDevice == (IRenderDevice *)0x0) {
    bVar23 = false;
    bVar24 = false;
    bVar25 = false;
    bVar22 = false;
  }
  else {
    iVar7 = (*(pDevice->super_IObject)._vptr_IObject[0x18])();
    pRVar10 = (RENDER_DEVICE_TYPE *)CONCAT44(extraout_var,iVar7);
    bVar22 = (char)pRVar10[3] == RENDER_DEVICE_TYPE_UNDEFINED;
    bVar23 = *(byte *)((long)pRVar10 + 0x3a) == 0;
    DeviceType = *pRVar10;
    bVar24 = *(byte *)((long)pRVar10 + 0x2d) == 0;
    bVar25 = (char)pRVar10[5] == RENDER_DEVICE_TYPE_UNDEFINED;
  }
  pPVar29 = Desc;
  if (7 < Desc->BindingIndex) {
    Resources._M_h._M_buckets = (__buckets_ptr)(Desc->super_DeviceObjectAttribs).Name;
    if (Resources._M_h._M_buckets == (__buckets_ptr)0x0) {
      Resources._M_h._M_buckets = (__buckets_ptr)0x5da79c;
    }
    ImtblSamplers._M_h._M_buckets =
         (__buckets_ptr)CONCAT44(ImtblSamplers._M_h._M_buckets._4_4_,(uint)Desc->BindingIndex);
    msg._M_dataplus._M_p._0_4_ = 7;
    in_R8 = "Description of a pipeline resource signature \'";
    LogError<true,char[47],char_const*,char[15],char[20],unsigned_int,char[38],unsigned_int,char[3]>
              (false,"ValidatePipelineResourceSignatureDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
               ,0x33,(char (*) [47])"Description of a pipeline resource signature \'",
               (char **)&Resources,(char (*) [15])"\' is invalid: ",
               (char (*) [20])"Desc.BindingIndex (",(uint *)&ImtblSamplers,
               (char (*) [38])") exceeds the maximum allowed value (",(uint *)&msg,
               (char (*) [3])0x668694);
  }
  uVar8 = Desc->NumResources;
  Args_4_00 = pPVar29;
  if (0xffff < uVar8) {
    Resources._M_h._M_buckets = (__buckets_ptr)(Desc->super_DeviceObjectAttribs).Name;
    if (Resources._M_h._M_buckets == (__buckets_ptr)0x0) {
      Resources._M_h._M_buckets = (__buckets_ptr)0x5da79c;
    }
    ImtblSamplers._M_h._M_buckets =
         (__buckets_ptr)CONCAT44(ImtblSamplers._M_h._M_buckets._4_4_,uVar8);
    in_R8 = "Description of a pipeline resource signature \'";
    LogError<true,char[47],char_const*,char[15],char[20],unsigned_int,char[38],unsigned_int,char[3]>
              (false,"ValidatePipelineResourceSignatureDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
               ,0x36,(char (*) [47])"Description of a pipeline resource signature \'",
               (char **)&Resources,(char (*) [15])"\' is invalid: ",
               (char (*) [20])"Desc.NumResources (",(uint *)&ImtblSamplers,
               (char (*) [38])") exceeds the maximum allowed value (",&MAX_RESOURCES_IN_SIGNATURE,
               (char (*) [3])0x668694);
    uVar8 = pPVar29->NumResources;
    Desc = pPVar29;
  }
  if ((uVar8 != 0) && (Desc->Resources == (PipelineResourceDesc *)0x0)) {
    Resources._M_h._M_buckets = (__buckets_ptr)(Desc->super_DeviceObjectAttribs).Name;
    if (Resources._M_h._M_buckets == (__buckets_ptr)0x0) {
      Resources._M_h._M_buckets = (__buckets_ptr)0x5da79c;
    }
    ImtblSamplers._M_h._M_buckets =
         (__buckets_ptr)CONCAT44(ImtblSamplers._M_h._M_buckets._4_4_,uVar8);
    in_R8 = "Description of a pipeline resource signature \'";
    LogError<true,char[47],char_const*,char[15],char[20],unsigned_int,char[43]>
              (false,"ValidatePipelineResourceSignatureDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
               ,0x39,(char (*) [47])"Description of a pipeline resource signature \'",
               (char **)&Resources,(char (*) [15])"\' is invalid: ",
               (char (*) [20])"Desc.NumResources (",(uint *)&ImtblSamplers,
               (char (*) [43])") is not zero, but Desc.Resources is null.");
  }
  if ((Desc->NumImmutableSamplers != 0) && (Desc->ImmutableSamplers == (ImmutableSamplerDesc *)0x0))
  {
    Resources._M_h._M_buckets = (__buckets_ptr)(Desc->super_DeviceObjectAttribs).Name;
    if (Resources._M_h._M_buckets == (__buckets_ptr)0x0) {
      Resources._M_h._M_buckets = (__buckets_ptr)0x5da79c;
    }
    ImtblSamplers._M_h._M_buckets =
         (__buckets_ptr)CONCAT44(ImtblSamplers._M_h._M_buckets._4_4_,Desc->NumImmutableSamplers);
    in_R8 = "Description of a pipeline resource signature \'";
    LogError<true,char[47],char_const*,char[15],char[28],unsigned_int,char[51]>
              (false,"ValidatePipelineResourceSignatureDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
               ,0x3c,(char (*) [47])"Description of a pipeline resource signature \'",
               (char **)&Resources,(char (*) [15])"\' is invalid: ",
               (char (*) [28])"Desc.NumImmutableSamplers (",(uint *)&ImtblSamplers,
               (char (*) [51])") is not zero, but Desc.ImmutableSamplers is null.");
  }
  if ((Desc->UseCombinedTextureSamplers == true) &&
     ((Desc->CombinedSamplerSuffix == (char *)0x0 || (*Desc->CombinedSamplerSuffix == '\0')))) {
    Resources._M_h._M_buckets = (__buckets_ptr)(Desc->super_DeviceObjectAttribs).Name;
    if (Resources._M_h._M_buckets == (__buckets_ptr)0x0) {
      Resources._M_h._M_buckets = (__buckets_ptr)0x5da79c;
    }
    in_R8 = "Description of a pipeline resource signature \'";
    LogError<true,char[47],char_const*,char[15],char[89]>
              (false,"ValidatePipelineResourceSignatureDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
               ,0x3f,(char (*) [47])"Description of a pipeline resource signature \'",
               (char **)&Resources,(char (*) [15])"\' is invalid: ",
               (char (*) [89])
               "Desc.UseCombinedTextureSamplers is true, but Desc.CombinedSamplerSuffix is null or empty"
              );
  }
  Resources._M_h._M_buckets = &Resources._M_h._M_single_bucket;
  Resources._M_h._M_bucket_count = 1;
  Resources._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  Resources._M_h._M_element_count = 0;
  Resources._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  Resources._M_h._M_rehash_policy._M_next_resize = 0;
  Resources._M_h._M_single_bucket = (__node_base_ptr)0x0;
  uVar8 = 0;
  while( true ) {
    msg_3._M_dataplus._M_p._0_4_ = uVar8;
    if (Args_4_00->NumResources <= uVar8) break;
    pPVar20 = Args_4_00->Resources + uVar8;
    pcVar12 = Args_4_00->Resources[uVar8].Name;
    if (pcVar12 == (char *)0x0) {
      ImtblSamplers._M_h._M_buckets = (__buckets_ptr)(Args_4_00->super_DeviceObjectAttribs).Name;
      if (ImtblSamplers._M_h._M_buckets == (__buckets_ptr)0x0) {
        ImtblSamplers._M_h._M_buckets = (__buckets_ptr)0x5da79c;
      }
      in_R8 = "Description of a pipeline resource signature \'";
      LogError<true,char[47],char_const*,char[15],char[16],unsigned_int,char[25]>
                (false,"ValidatePipelineResourceSignatureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                 ,0x49,(char (*) [47])"Description of a pipeline resource signature \'",
                 (char **)&ImtblSamplers,(char (*) [15])"\' is invalid: ",(char (*) [16])0x6625fd,
                 (uint *)&msg_3,(char (*) [25])"].Name must not be null.");
      pcVar12 = pPVar20->Name;
    }
    if (*pcVar12 == '\0') {
      ImtblSamplers._M_h._M_buckets = (__buckets_ptr)(Args_4_00->super_DeviceObjectAttribs).Name;
      if (ImtblSamplers._M_h._M_buckets == (__buckets_ptr)0x0) {
        ImtblSamplers._M_h._M_buckets = (__buckets_ptr)0x5da79c;
      }
      in_R8 = "Description of a pipeline resource signature \'";
      LogError<true,char[47],char_const*,char[15],char[16],unsigned_int,char[26]>
                (false,"ValidatePipelineResourceSignatureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                 ,0x4c,(char (*) [47])"Description of a pipeline resource signature \'",
                 (char **)&ImtblSamplers,(char (*) [15])"\' is invalid: ",(char (*) [16])0x6625fd,
                 (uint *)&msg_3,(char (*) [26])"].Name must not be empty.");
    }
    if (pPVar20->ShaderStages == SHADER_TYPE_UNKNOWN) {
      ImtblSamplers._M_h._M_buckets = (__buckets_ptr)(Args_4_00->super_DeviceObjectAttribs).Name;
      if (ImtblSamplers._M_h._M_buckets == (__buckets_ptr)0x0) {
        ImtblSamplers._M_h._M_buckets = (__buckets_ptr)0x5da79c;
      }
      in_R8 = "Description of a pipeline resource signature \'";
      LogError<true,char[47],char_const*,char[15],char[16],unsigned_int,char[48]>
                (false,"ValidatePipelineResourceSignatureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                 ,0x4f,(char (*) [47])"Description of a pipeline resource signature \'",
                 (char **)&ImtblSamplers,(char (*) [15])"\' is invalid: ",(char (*) [16])0x6625fd,
                 (uint *)&msg_3,(char (*) [48])"].ShaderStages must not be SHADER_TYPE_UNKNOWN.");
    }
    if (pPVar20->ArraySize == 0) {
      ImtblSamplers._M_h._M_buckets = (__buckets_ptr)(Args_4_00->super_DeviceObjectAttribs).Name;
      if (ImtblSamplers._M_h._M_buckets == (__buckets_ptr)0x0) {
        ImtblSamplers._M_h._M_buckets = (__buckets_ptr)0x5da79c;
      }
      in_R8 = "Description of a pipeline resource signature \'";
      LogError<true,char[47],char_const*,char[15],char[16],unsigned_int,char[27]>
                (false,"ValidatePipelineResourceSignatureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                 ,0x52,(char (*) [47])"Description of a pipeline resource signature \'",
                 (char **)&ImtblSamplers,(char (*) [15])"\' is invalid: ",(char (*) [16])0x6625fd,
                 (uint *)&msg_3,(char (*) [27])"].ArraySize must not be 0.");
    }
    HashMapStringKey::HashMapStringKey((HashMapStringKey *)&ImtblSamplers,pPVar20->Name,false);
    pVar26 = std::
             _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
             ::equal_range(&Resources._M_h,(key_type *)&ImtblSamplers);
    HashMapStringKey::Clear((HashMapStringKey *)&ImtblSamplers);
    uVar18 = extraout_RDX;
    for (_Var11._M_cur =
              (__node_type *)
              pVar26.first.
              super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
              ._M_cur;
        (_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
         )_Var11._M_cur !=
        pVar26.second.
        super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
        ._M_cur.
        super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
        ; _Var11._M_cur = (__node_type *)((_Var11._M_cur)->super__Hash_node_base)._M_nxt) {
      pacVar16 = (char (*) [51])(ulong)pPVar20->ShaderStages;
      if ((*(SHADER_TYPE *)
            (*(long *)((long)&((_Var11._M_cur)->
                              super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
                              ).
                              super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>_>
                              ._M_storage._M_storage + 0x10) + 8) & pPVar20->ShaderStages) !=
          SHADER_TYPE_UNKNOWN) {
        ImtblSamplers._M_h._M_buckets = (__buckets_ptr)(Args_4_00->super_DeviceObjectAttribs).Name;
        if (ImtblSamplers._M_h._M_buckets == (__buckets_ptr)0x0) {
          ImtblSamplers._M_h._M_buckets = (__buckets_ptr)0x5da79c;
        }
        pacVar16 = (char (*) [51])0x5b;
        in_R8 = "Description of a pipeline resource signature \'";
        LogError<true,char[47],char_const*,char[15],char[31],char_const*,char[149]>
                  (false,"ValidatePipelineResourceSignatureDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                   ,0x5b,(char (*) [47])"Description of a pipeline resource signature \'",
                   (char **)&ImtblSamplers,(char (*) [15])"\' is invalid: ",
                   (char (*) [31])"Multiple resources with name \'",&pPVar20->Name,
                   (char (*) [149])
                   "\' specify overlapping shader stages. There may be multiple resources with the same name in different shader stages, but the stages must not overlap."
                  );
        uVar18 = extraout_RDX_00;
      }
      SVar17 = (SHADER_TYPE)uVar18;
      if (bVar22) {
        if (*(int *)(*(long *)((long)&((_Var11._M_cur)->
                                      super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
                                      ).
                                      super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>_>
                                      ._M_storage._M_storage + 0x10) + 8) == 0) {
          FormatString<char[26],char[51]>
                    ((string *)&ImtblSamplers,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])"res_it->second.ShaderStages != SHADER_TYPE_UNKNOWN",pacVar16);
          DebugAssertionFailed
                    ((Char *)ImtblSamplers._M_h._M_buckets,"ValidatePipelineResourceSignatureDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                     ,0x60);
          std::__cxx11::string::~string((string *)&ImtblSamplers);
          SVar17 = extraout_EDX;
        }
        AssignedImtblSamplers._M_h._M_buckets =
             (__buckets_ptr)(Args_4_00->super_DeviceObjectAttribs).Name;
        if (AssignedImtblSamplers._M_h._M_buckets == (__buckets_ptr)0x0) {
          AssignedImtblSamplers._M_h._M_buckets = (__buckets_ptr)0x5da79c;
        }
        GetShaderStagesString_abi_cxx11_
                  ((string *)&ImtblSamplers,(Diligent *)(ulong)pPVar20->ShaderStages,SVar17);
        GetShaderStagesString_abi_cxx11_
                  (&msg,(Diligent *)
                        (ulong)*(uint *)(*(long *)((long)&((_Var11._M_cur)->
                                                                                                                    
                                                  super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
                                                  ).
                                                  super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>_>
                                                  ._M_storage._M_storage + 0x10) + 8),ShaderStages);
        in_R8 = "Description of a pipeline resource signature \'";
        LogError<true,char[47],char_const*,char[15],char[98],char_const*,char[20],std::__cxx11::string,char[6],std::__cxx11::string,char[184]>
                  (false,"ValidatePipelineResourceSignatureDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                   ,0x66,(char (*) [47])"Description of a pipeline resource signature \'",
                   (char **)&AssignedImtblSamplers,(char (*) [15])"\' is invalid: ",
                   (char (*) [98])
                   "This device does not support separable programs, but there are separate resources with the name \'"
                   ,&pPVar20->Name,(char (*) [20])"\' in shader stages ",(string *)&ImtblSamplers,
                   (char (*) [6])0x6c4dfa,&msg,(char (*) [184])0x6643ff);
        std::__cxx11::string::~string((string *)&msg);
        std::__cxx11::string::~string((string *)&ImtblSamplers);
        uVar18 = extraout_RDX_01;
      }
    }
    PVar4 = GetValidPipelineResourceFlags(pPVar20->ResourceType);
    PVar5 = pPVar20->Flags;
    SVar17 = extraout_EDX_00;
    if ((PVar5 & ~PVar4) != PIPELINE_RESOURCE_FLAG_NONE) {
      AssignedImtblSamplers._M_h._M_buckets =
           (__buckets_ptr)(Args_4_00->super_DeviceObjectAttribs).Name;
      if (AssignedImtblSamplers._M_h._M_buckets == (__buckets_ptr)0x0) {
        AssignedImtblSamplers._M_h._M_buckets = (__buckets_ptr)0x5da79c;
      }
      GetPipelineResourceFlagsString_abi_cxx11_
                ((string *)&ImtblSamplers,(Diligent *)(ulong)PVar5,PIPELINE_RESOURCE_FLAG_NONE,true,
                 in_R8);
      AssignedSamplerName._M_dataplus._M_p =
           GetShaderResourceTypeLiteralName(pPVar20->ResourceType,false);
      GetPipelineResourceFlagsString_abi_cxx11_
                (&msg,(Diligent *)(ulong)PVar4,PIPELINE_RESOURCE_FLAG_NONE,true,in_R8);
      in_R8 = "Description of a pipeline resource signature \'";
      LogError<true,char[47],char_const*,char[15],char[26],unsigned_int,char[10],std::__cxx11::string,char[45],char_const*,char[3],std::__cxx11::string,char[2]>
                (false,"ValidatePipelineResourceSignatureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                 ,0x6f,(char (*) [47])"Description of a pipeline resource signature \'",
                 (char **)&AssignedImtblSamplers,(char (*) [15])"\' is invalid: ",
                 (char (*) [26])"Incorrect Desc.Resources[",(uint *)&msg_3,
                 (char (*) [10])"].Flags (",(string *)&ImtblSamplers,
                 (char (*) [45])"). Only the following flags are valid for a ",
                 (char **)&AssignedSamplerName,(char (*) [3])0x63bcc6,&msg,(char (*) [2])0x665ed2);
      std::__cxx11::string::~string((string *)&msg);
      std::__cxx11::string::~string((string *)&ImtblSamplers);
      PVar5 = pPVar20->Flags;
      SVar17 = extraout_EDX_01;
    }
    if (((PVar5 & PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER) >> 2 & bVar23) == 1) {
      ImtblSamplers._M_h._M_buckets = (__buckets_ptr)(Args_4_00->super_DeviceObjectAttribs).Name;
      if (ImtblSamplers._M_h._M_buckets == (__buckets_ptr)0x0) {
        ImtblSamplers._M_h._M_buckets = (__buckets_ptr)0x5da79c;
      }
      in_R8 = "Description of a pipeline resource signature \'";
      LogError<true,char[47],char_const*,char[15],char[26],unsigned_int,char[101]>
                (false,"ValidatePipelineResourceSignatureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                 ,0x74,(char (*) [47])"Description of a pipeline resource signature \'",
                 (char **)&ImtblSamplers,(char (*) [15])"\' is invalid: ",
                 (char (*) [26])"Incorrect Desc.Resources[",(uint *)&msg_3,
                 (char (*) [101])
                 "].Flags (FORMATTED_BUFFER). The flag can only be used if FormattedBuffers device feature is enabled."
                );
      PVar5 = pPVar20->Flags;
      SVar17 = extraout_EDX_02;
    }
    if (((PVar5 & PIPELINE_RESOURCE_FLAG_RUNTIME_ARRAY) >> 3 & bVar24) == 1) {
      ImtblSamplers._M_h._M_buckets = (__buckets_ptr)(Args_4_00->super_DeviceObjectAttribs).Name;
      if (ImtblSamplers._M_h._M_buckets == (__buckets_ptr)0x0) {
        ImtblSamplers._M_h._M_buckets = (__buckets_ptr)0x5da79c;
      }
      in_R8 = "Description of a pipeline resource signature \'";
      LogError<true,char[47],char_const*,char[15],char[26],unsigned_int,char[109]>
                (false,"ValidatePipelineResourceSignatureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                 ,0x79,(char (*) [47])"Description of a pipeline resource signature \'",
                 (char **)&ImtblSamplers,(char (*) [15])"\' is invalid: ",
                 (char (*) [26])"Incorrect Desc.Resources[",(uint *)&msg_3,
                 (char (*) [109])
                 "].Flags (RUNTIME_ARRAY). The flag can only be used if ShaderResourceRuntimeArrays device feature is enabled."
                );
      SVar17 = extraout_EDX_03;
    }
    SVar6 = pPVar20->ResourceType;
    if ((bool)(SVar6 == SHADER_RESOURCE_TYPE_ACCEL_STRUCT & bVar25)) {
      ImtblSamplers._M_h._M_buckets = (__buckets_ptr)(Args_4_00->super_DeviceObjectAttribs).Name;
      if (ImtblSamplers._M_h._M_buckets == (__buckets_ptr)0x0) {
        ImtblSamplers._M_h._M_buckets = (__buckets_ptr)0x5da79c;
      }
      in_R8 = "Description of a pipeline resource signature \'";
      LogError<true,char[47],char_const*,char[15],char[26],unsigned_int,char[71]>
                (false,"ValidatePipelineResourceSignatureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                 ,0x7e,(char (*) [47])"Description of a pipeline resource signature \'",
                 (char **)&ImtblSamplers,(char (*) [15])"\' is invalid: ",
                 (char (*) [26])"Incorrect Desc.Resources[",(uint *)&msg_3,
                 (char (*) [71])
                 "].ResourceType (ACCEL_STRUCT): ray tracing is not supported by device.");
      SVar6 = pPVar20->ResourceType;
      SVar17 = extraout_EDX_04;
    }
    if ((SVar6 == SHADER_RESOURCE_TYPE_INPUT_ATTACHMENT) &&
       (pPVar20->ShaderStages != SHADER_TYPE_PIXEL)) {
      msg._M_dataplus._M_p = (Args_4_00->super_DeviceObjectAttribs).Name;
      if (msg._M_dataplus._M_p == (char *)0x0) {
        msg._M_dataplus._M_p = "";
      }
      GetShaderStagesString_abi_cxx11_
                ((string *)&ImtblSamplers,(Diligent *)(ulong)pPVar20->ShaderStages,SVar17);
      in_R8 = "Description of a pipeline resource signature \'";
      LogError<true,char[47],char_const*,char[15],char[16],unsigned_int,char[90],std::__cxx11::string,char[2]>
                (false,"ValidatePipelineResourceSignatureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                 ,0x83,(char (*) [47])"Description of a pipeline resource signature \'",
                 (char **)&msg,(char (*) [15])"\' is invalid: ",(char (*) [16])0x6625fd,
                 (uint *)&msg_3,
                 (char (*) [90])
                 "].ResourceType (INPUT_ATTACHMENT) is only supported in pixel shader but ShaderStages are "
                 ,(string *)&ImtblSamplers,(char (*) [2])0x665ed2);
      std::__cxx11::string::~string((string *)&ImtblSamplers);
    }
    if ((((DeviceType < RENDER_DEVICE_TYPE_WEBGPU) && ((0x46U >> (DeviceType & 0x1f) & 1) != 0)) &&
        ((pPVar20->Flags & PIPELINE_RESOURCE_FLAG_COMBINED_SAMPLER) != PIPELINE_RESOURCE_FLAG_NONE))
       && (Args_4_00->UseCombinedTextureSamplers == false)) {
      ImtblSamplers._M_h._M_buckets = (__buckets_ptr)(Args_4_00->super_DeviceObjectAttribs).Name;
      if (ImtblSamplers._M_h._M_buckets == (__buckets_ptr)0x0) {
        ImtblSamplers._M_h._M_buckets = (__buckets_ptr)0x5da79c;
      }
      in_R8 = "Description of a pipeline resource signature \'";
      LogError<true,char[47],char_const*,char[15],char[16],unsigned_int,char[197]>
                (false,"ValidatePipelineResourceSignatureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                 ,0x8c,(char (*) [47])"Description of a pipeline resource signature \'",
                 (char **)&ImtblSamplers,(char (*) [15])"\' is invalid: ",(char (*) [16])0x6625fd,
                 (uint *)&msg_3,
                 (char (*) [197])
                 "].Flags contain COMBINED_SAMPLER flag, but Desc.UseCombinedTextureSamplers is false. In Direct3D and Metal backends, COMBINED_SAMPLER flag may only be used when UseCombinedTextureSamplers is true."
                );
    }
    if ((pPVar20->Flags & PIPELINE_RESOURCE_FLAG_GENERAL_INPUT_ATTACHMENT) !=
        PIPELINE_RESOURCE_FLAG_NONE &&
        (DeviceType != RENDER_DEVICE_TYPE_VULKAN && DeviceType != RENDER_DEVICE_TYPE_UNDEFINED)) {
      ImtblSamplers._M_h._M_buckets = (__buckets_ptr)(Args_4_00->super_DeviceObjectAttribs).Name;
      if (ImtblSamplers._M_h._M_buckets == (__buckets_ptr)0x0) {
        ImtblSamplers._M_h._M_buckets = (__buckets_ptr)0x5da79c;
      }
      in_R8 = "Description of a pipeline resource signature \'";
      LogError<true,char[47],char_const*,char[15],char[16],unsigned_int,char[71]>
                (false,"ValidatePipelineResourceSignatureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                 ,0x94,(char (*) [47])"Description of a pipeline resource signature \'",
                 (char **)&ImtblSamplers,(char (*) [15])"\' is invalid: ",(char (*) [16])0x6625fd,
                 (uint *)&msg_3,
                 (char (*) [71])
                 "].Flags contain GENERAL_INPUT_ATTACHMENT which is only valid in Vulkan");
    }
    std::
    _Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,Diligent::PipelineResourceDesc_const&>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::PipelineResourceDesc_const&>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
    ::_M_emplace<char_const*const&,Diligent::PipelineResourceDesc_const&>
              ((_Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,Diligent::PipelineResourceDesc_const&>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::PipelineResourceDesc_const&>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
                *)&Resources,pPVar20,pPVar20);
    uVar8 = (uint)msg_3._M_dataplus._M_p + 1;
  }
  ImtblSamplers._M_h._M_buckets = &ImtblSamplers._M_h._M_single_bucket;
  ImtblSamplers._M_h._M_bucket_count = 1;
  ImtblSamplers._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  ImtblSamplers._M_h._M_element_count = 0;
  ImtblSamplers._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  ImtblSamplers._M_h._M_rehash_policy._M_next_resize = 0;
  ImtblSamplers._M_h._M_single_bucket = (__node_base_ptr)0x0;
  uVar8 = 0;
  while( true ) {
    msg_3._M_dataplus._M_p._0_4_ = uVar8;
    if (Args_4_00->NumImmutableSamplers <= uVar8) break;
    pIVar21 = Args_4_00->ImmutableSamplers;
    Args_4_01 = &pIVar21[uVar8].SamplerOrTextureName;
    pcVar12 = *Args_4_01;
    if (pcVar12 == (char *)0x0) {
      msg._M_dataplus._M_p = (Args_4_00->super_DeviceObjectAttribs).Name;
      if (msg._M_dataplus._M_p == (char *)0x0) {
        msg._M_dataplus._M_p = "";
      }
      LogError<true,char[47],char_const*,char[15],char[24],unsigned_int,char[41]>
                (false,"ValidatePipelineResourceSignatureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                 ,0xab,(char (*) [47])"Description of a pipeline resource signature \'",
                 (char **)&msg,(char (*) [15])"\' is invalid: ",
                 (char (*) [24])"Desc.ImmutableSamplers[",(uint *)&msg_3,
                 (char (*) [41])"].SamplerOrTextureName must not be null.");
      pcVar12 = *Args_4_01;
    }
    if (*pcVar12 == '\0') {
      msg._M_dataplus._M_p = (Args_4_00->super_DeviceObjectAttribs).Name;
      if (msg._M_dataplus._M_p == (char *)0x0) {
        msg._M_dataplus._M_p = "";
      }
      LogError<true,char[47],char_const*,char[15],char[24],unsigned_int,char[42]>
                (false,"ValidatePipelineResourceSignatureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                 ,0xae,(char (*) [47])"Description of a pipeline resource signature \'",
                 (char **)&msg,(char (*) [15])"\' is invalid: ",
                 (char (*) [24])"Desc.ImmutableSamplers[",(uint *)&msg_3,
                 (char (*) [42])"].SamplerOrTextureName must not be empty.");
    }
    pIVar21 = pIVar21 + uVar8;
    if (pIVar21->ShaderStages == SHADER_TYPE_UNKNOWN) {
      msg._M_dataplus._M_p = (Args_4_00->super_DeviceObjectAttribs).Name;
      if (msg._M_dataplus._M_p == (char *)0x0) {
        msg._M_dataplus._M_p = "";
      }
      LogError<true,char[47],char_const*,char[15],char[24],unsigned_int,char[48]>
                (false,"ValidatePipelineResourceSignatureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                 ,0xb1,(char (*) [47])"Description of a pipeline resource signature \'",
                 (char **)&msg,(char (*) [15])"\' is invalid: ",
                 (char (*) [24])"Desc.ImmutableSamplers[",(uint *)&msg_3,
                 (char (*) [48])"].ShaderStages must not be SHADER_TYPE_UNKNOWN.");
    }
    HashMapStringKey::HashMapStringKey((HashMapStringKey *)&msg,*Args_4_01,false);
    pVar27 = std::
             _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
             ::equal_range(&ImtblSamplers._M_h,(key_type *)&msg);
    HashMapStringKey::Clear((HashMapStringKey *)&msg);
    uVar18 = extraout_RDX_02;
    for (_Var13._M_cur =
              (__node_type *)
              pVar27.first.
              super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
              ._M_cur;
        (_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
         )_Var13._M_cur !=
        pVar27.second.
        super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
        ._M_cur.
        super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
        ; _Var13._M_cur = (__node_type *)((_Var13._M_cur)->super__Hash_node_base)._M_nxt) {
      pacVar16 = (char (*) [51])(ulong)pIVar21->ShaderStages;
      if ((**(SHADER_TYPE **)
             ((long)&((_Var13._M_cur)->
                     super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
                     ).
                     super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>_>
                     ._M_storage._M_storage + 0x10) & pIVar21->ShaderStages) != SHADER_TYPE_UNKNOWN)
      {
        msg._M_dataplus._M_p = (Args_4_00->super_DeviceObjectAttribs).Name;
        if (msg._M_dataplus._M_p == (char *)0x0) {
          msg._M_dataplus._M_p = "";
        }
        pacVar16 = (char (*) [51])0xba;
        LogError<true,char[47],char_const*,char[15],char[40],char_const*,char[158]>
                  (false,"ValidatePipelineResourceSignatureDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                   ,0xba,(char (*) [47])"Description of a pipeline resource signature \'",
                   (char **)&msg,(char (*) [15])"\' is invalid: ",
                   (char (*) [40])"Multiple immutable samplers with name \'",Args_4_01,
                   (char (*) [158])
                   "\' specify overlapping shader stages. There may be multiple immutable samplers with the same name in different shader stages, but the stages must not overlap."
                  );
        uVar18 = extraout_RDX_03;
      }
      SVar17 = (SHADER_TYPE)uVar18;
      if (bVar22) {
        if (**(int **)((long)&((_Var13._M_cur)->
                              super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
                              ).
                              super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>_>
                              ._M_storage._M_storage + 0x10) == 0) {
          FormatString<char[26],char[51]>
                    (&msg,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])"sam_it->second.ShaderStages != SHADER_TYPE_UNKNOWN",pacVar16);
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"ValidatePipelineResourceSignatureDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                     ,0xbe);
          std::__cxx11::string::~string((string *)&msg);
          SVar17 = extraout_EDX_05;
        }
        AssignedSamplerName._M_dataplus._M_p = (Args_4_00->super_DeviceObjectAttribs).Name;
        if (AssignedSamplerName._M_dataplus._M_p == (char *)0x0) {
          AssignedSamplerName._M_dataplus._M_p = "";
        }
        GetShaderStagesString_abi_cxx11_(&msg,(Diligent *)(ulong)pIVar21->ShaderStages,SVar17);
        GetShaderStagesString_abi_cxx11_
                  ((String *)&AssignedImtblSamplers,
                   (Diligent *)
                   (ulong)**(uint **)((long)&((_Var13._M_cur)->
                                             super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
                                             ).
                                             super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>_>
                                             ._M_storage._M_storage + 0x10),ShaderStages_00);
        LogError<true,char[47],char_const*,char[15],char[107],char_const*,char[20],std::__cxx11::string,char[6],std::__cxx11::string,char[192]>
                  (false,"ValidatePipelineResourceSignatureDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                   ,0xc4,(char (*) [47])"Description of a pipeline resource signature \'",
                   (char **)&AssignedSamplerName,(char (*) [15])"\' is invalid: ",
                   (char (*) [107])
                   "This device does not support separable programs, but there are separate immutable samplers with the name \'"
                   ,Args_4_01,(char (*) [20])"\' in shader stages ",&msg,(char (*) [6])0x6c4dfa,
                   (String *)&AssignedImtblSamplers,
                   (char (*) [192])
                   ". When separable programs are not supported, every resource is always shared between all stages. Use distinct immutable sampler names for each stage or define a single sampler for all stages."
                  );
        std::__cxx11::string::~string((string *)&AssignedImtblSamplers);
        std::__cxx11::string::~string((string *)&msg);
        uVar18 = extraout_RDX_04;
      }
    }
    std::
    _Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,Diligent::ImmutableSamplerDesc_const&>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::ImmutableSamplerDesc_const&>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
    ::_M_emplace<char_const*const&,Diligent::ImmutableSamplerDesc_const&>
              ((_Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,Diligent::ImmutableSamplerDesc_const&>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::ImmutableSamplerDesc_const&>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
                *)&ImtblSamplers,Args_4_01,pIVar21);
    uVar8 = (uint)msg_3._M_dataplus._M_p + 1;
  }
  if (Args_4_00->UseCombinedTextureSamplers != false) {
    if (Args_4_00->CombinedSamplerSuffix == (Char *)0x0) {
      FormatString<char[26],char[38]>
                (&msg,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"Desc.CombinedSamplerSuffix != nullptr",(char (*) [38])Args_4_00);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"ValidatePipelineResourceSignatureDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                 ,0xcd);
      std::__cxx11::string::~string((string *)&msg);
    }
    msg._M_dataplus._M_p = (pointer)&p_Stack_c8;
    msg._M_string_length = 1;
    msg.field_2._M_allocated_capacity = 0;
    msg.field_2._8_8_ = 0;
    p_Stack_c8 = (__node_base_ptr)0x0;
    AssignedImtblSamplers._M_h._M_buckets = &AssignedImtblSamplers._M_h._M_single_bucket;
    AssignedImtblSamplers._M_h._M_bucket_count = 1;
    AssignedImtblSamplers._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    AssignedImtblSamplers._M_h._M_element_count = 0;
    AssignedImtblSamplers._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    AssignedImtblSamplers._M_h._M_rehash_policy._M_next_resize = 0;
    AssignedImtblSamplers._M_h._M_single_bucket = (__node_base_ptr)0x0;
    uVar19 = 0;
    while( true ) {
      uVar14 = (ulong)Args_4_00->NumResources;
      if (uVar14 <= uVar19) break;
      pPVar29 = Args_4_00;
      if (Args_4_00->Resources[uVar19].ResourceType == SHADER_RESOURCE_TYPE_TEXTURE_SRV) {
        pPVar20 = Args_4_00->Resources + uVar19;
        std::__cxx11::string::string((string *)&msg_3,pPVar20->Name,(allocator *)&local_c0);
        std::operator+(&AssignedSamplerName,&msg_3,pPVar29->CombinedSamplerSuffix);
        std::__cxx11::string::~string((string *)&msg_3);
        HashMapStringKey::HashMapStringKey
                  ((HashMapStringKey *)&msg_3,AssignedSamplerName._M_dataplus._M_p,false);
        pVar26 = std::
                 _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                 ::equal_range(&Resources._M_h,(key_type *)&msg_3);
        HashMapStringKey::Clear((HashMapStringKey *)&msg_3);
        for (_Var11._M_cur =
                  (__node_type *)
                  pVar26.first.
                  super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
                  ._M_cur;
            (_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
             )_Var11._M_cur !=
            pVar26.second.
            super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
            ._M_cur.
            super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
            ; _Var11._M_cur = (__node_type *)((_Var11._M_cur)->super__Hash_node_base)._M_nxt) {
          Args_4 = *(char ***)
                    ((long)&((_Var11._M_cur)->
                            super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_false>
                            ).
                            super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>_>
                            ._M_storage._M_storage + 0x10);
          bVar25 = std::operator==(&AssignedSamplerName,*Args_4);
          SVar17 = extraout_EDX_06;
          if (!bVar25) {
            FormatString<char[26],char[32]>
                      (&msg_3,(Diligent *)"Debug expression failed:\n",
                       (char (*) [26])"AssignedSamplerName == Sam.Name",(char (*) [32])Args_4_00);
            Args_4_00 = (PipelineResourceSignatureDesc *)0xe3;
            DebugAssertionFailed
                      (msg_3._M_dataplus._M_p,"ValidatePipelineResourceSignatureDesc",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                       ,0xe3);
            std::__cxx11::string::~string((string *)&msg_3);
            SVar17 = extraout_EDX_07;
          }
          SVar2 = pPVar20->ShaderStages;
          SVar9 = *(SHADER_TYPE *)(Args_4 + 1) & SVar2;
          if (SVar9 != SHADER_TYPE_UNKNOWN) {
            ppcVar1 = Args_4 + 1;
            if (*(char *)(Args_4 + 2) != '\x06') {
              msg_3._M_dataplus._M_p = (pPVar29->super_DeviceObjectAttribs).Name;
              if (msg_3._M_dataplus._M_p == (char *)0x0) {
                msg_3._M_dataplus._M_p = "";
              }
              Args_4_00 = (PipelineResourceSignatureDesc *)0xe9;
              LogError<true,char[47],char_const*,char[15],char[11],char_const*,char[26],char_const*,char[20]>
                        (false,"ValidatePipelineResourceSignatureDesc",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                         ,0xe9,(char (*) [47])"Description of a pipeline resource signature \'",
                         (char **)&msg_3,(char (*) [15])"\' is invalid: ",
                         (char (*) [11])"Resource \'",Args_4,
                         (char (*) [26])"\' combined with texture \'",&pPVar20->Name,
                         (char (*) [20])"\' is not a sampler.");
              SVar2 = pPVar20->ShaderStages;
              SVar9 = *(SHADER_TYPE *)ppcVar1 & SVar2;
              SVar17 = extraout_EDX_08;
            }
            if (SVar9 != SVar2) {
              local_138 = (pPVar29->super_DeviceObjectAttribs).Name;
              if (local_138 == (char *)0x0) {
                local_138 = "";
              }
              GetShaderStagesString_abi_cxx11_(&msg_3,(Diligent *)(ulong)SVar2,SVar17);
              GetShaderStagesString_abi_cxx11_
                        (&local_c0,(Diligent *)(ulong)*(uint *)ppcVar1,ShaderStages_01);
              Args_4_00 = (PipelineResourceSignatureDesc *)0xf1;
              LogError<true,char[47],char_const*,char[15],char[10],char_const*,char[47],std::__cxx11::string,char[16],char_const*,char[50],std::__cxx11::string,char[231]>
                        (false,"ValidatePipelineResourceSignatureDesc",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                         ,0xf1,(char (*) [47])"Description of a pipeline resource signature \'",
                         &local_138,(char (*) [15])"\' is invalid: ",(char (*) [10])0x65e42f,
                         &pPVar20->Name,
                         (char (*) [47])"\' is defined for the following shader stages: ",&msg_3,
                         (char (*) [16])", but sampler \'",Args_4,
                         (char (*) [50])"\' assigned to it uses only some of these stages: ",
                         &local_c0,
                         (char (*) [231])
                         ". A resource that is present in multiple shader stages can\'t be combined with different samplers in different stages. Either use separate resources for different stages, or define the sampler for all stages that the resource uses."
                        );
              std::__cxx11::string::~string((string *)&local_c0);
              std::__cxx11::string::~string((string *)&msg_3);
            }
            if (*(SHADER_RESOURCE_VARIABLE_TYPE *)((long)Args_4 + 0x11) != pPVar20->VarType) {
              msg_3._M_dataplus._M_p = (pPVar29->super_DeviceObjectAttribs).Name;
              if (msg_3._M_dataplus._M_p == (char *)0x0) {
                msg_3._M_dataplus._M_p = "";
              }
              local_c0._M_dataplus._M_p = GetShaderVariableTypeLiteralName(pPVar20->VarType,false);
              local_138 = GetShaderVariableTypeLiteralName
                                    (*(SHADER_RESOURCE_VARIABLE_TYPE *)((long)Args_4 + 0x11),false);
              Args_4_00 = (PipelineResourceSignatureDesc *)0xf8;
              LogError<true,char[47],char_const*,char[15],char[11],char_const*,char[24],char_const*,char[28],char_const*,char[15],char_const*,char[26]>
                        (false,"ValidatePipelineResourceSignatureDesc",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                         ,0xf8,(char (*) [47])"Description of a pipeline resource signature \'",
                         (char **)&msg_3,(char (*) [15])"\' is invalid: ",
                         (char (*) [11])"The type (",(char **)&local_c0,
                         (char (*) [24])") of texture resource \'",&pPVar20->Name,
                         (char (*) [28])"\' does not match the type (",&local_138,
                         (char (*) [15])") of sampler \'",Args_4,
                         (char (*) [26])"\' that is assigned to it.");
            }
            std::
            _Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,Diligent::SHADER_TYPE>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::SHADER_TYPE>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
            ::_M_emplace<char_const*const&,Diligent::SHADER_TYPE_const&>
                      ((_Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,Diligent::SHADER_TYPE>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::SHADER_TYPE>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
                        *)&msg,Args_4,ppcVar1);
            break;
          }
        }
        std::__cxx11::string::~string((string *)&AssignedSamplerName);
        HashMapStringKey::HashMapStringKey
                  ((HashMapStringKey *)&AssignedSamplerName,pPVar20->Name,false);
        pVar27 = std::
                 _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                 ::equal_range(&ImtblSamplers._M_h,(key_type *)&AssignedSamplerName);
        HashMapStringKey::Clear((HashMapStringKey *)&AssignedSamplerName);
        for (_Var13._M_cur =
                  (__node_type *)
                  pVar27.first.
                  super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
                  ._M_cur;
            (_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
             )_Var13._M_cur !=
            pVar27.second.
            super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
            ._M_cur.
            super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
            ; _Var13._M_cur = (__node_type *)((_Var13._M_cur)->super__Hash_node_base)._M_nxt) {
          pSVar3 = *(SHADER_TYPE **)
                    ((long)&((_Var13._M_cur)->
                            super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_false>
                            ).
                            super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>_>
                            ._M_storage._M_storage + 0x10);
          iVar7 = strcmp(*(char **)(pSVar3 + 2),pPVar20->Name);
          SVar17 = extraout_EDX_09;
          if (iVar7 != 0) {
            FormatString<char[26],char[48]>
                      (&AssignedSamplerName,(Diligent *)"Debug expression failed:\n",
                       (char (*) [26])"strcmp(Sam.SamplerOrTextureName, Res.Name) == 0",
                       (char (*) [48])Args_4_00);
            Args_4_00 = (PipelineResourceSignatureDesc *)0x107;
            DebugAssertionFailed
                      (AssignedSamplerName._M_dataplus._M_p,"ValidatePipelineResourceSignatureDesc",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                       ,0x107);
            std::__cxx11::string::~string((string *)&AssignedSamplerName);
            SVar17 = extraout_EDX_10;
          }
          SVar2 = pPVar20->ShaderStages;
          if ((*pSVar3 & SVar2) != SHADER_TYPE_UNKNOWN) {
            if ((*pSVar3 & SVar2) != SVar2) {
              local_c0._M_dataplus._M_p = (pPVar29->super_DeviceObjectAttribs).Name;
              if (local_c0._M_dataplus._M_p == (char *)0x0) {
                local_c0._M_dataplus._M_p = "";
              }
              GetShaderStagesString_abi_cxx11_(&AssignedSamplerName,(Diligent *)(ulong)SVar2,SVar17)
              ;
              GetShaderStagesString_abi_cxx11_(&msg_3,(Diligent *)(ulong)*pSVar3,ShaderStages_02);
              LogError<true,char[47],char_const*,char[15],char[10],char_const*,char[47],std::__cxx11::string,char[80],std::__cxx11::string,char[250]>
                        (false,"ValidatePipelineResourceSignatureDesc",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineResourceSignatureBase.cpp"
                         ,0x110,(char (*) [47])"Description of a pipeline resource signature \'",
                         (char **)&local_c0,(char (*) [15])"\' is invalid: ",(char (*) [10])0x65e42f
                         ,&pPVar20->Name,
                         (char (*) [47])"\' is defined for the following shader stages: ",
                         &AssignedSamplerName,
                         (char (*) [80])
                         ", but immutable sampler that is assigned to it uses only some of these stages: "
                         ,&msg_3,(char (*) [250])
                                 ". A resource that is present in multiple shader stages can\'t be combined with different immutable samples in different stages. Either use separate resources for different stages, or define the immutable sampler for all stages that the resource uses."
                        );
              std::__cxx11::string::~string((string *)&msg_3);
              std::__cxx11::string::~string((string *)&AssignedSamplerName);
            }
            std::
            _Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,Diligent::SHADER_TYPE>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::SHADER_TYPE>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
            ::_M_emplace<char_const*const&,Diligent::SHADER_TYPE_const&>
                      ((_Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,Diligent::SHADER_TYPE>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::SHADER_TYPE>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
                        *)&AssignedImtblSamplers,pSVar3 + 2,pSVar3);
            break;
          }
        }
      }
      uVar19 = uVar19 + 1;
      Args_4_00 = pPVar29;
    }
    for (uVar19 = 0; uVar19 < uVar14; uVar19 = uVar19 + 1) {
      if (Args_4_00->Resources[uVar19].ResourceType == SHADER_RESOURCE_TYPE_SAMPLER) {
        pPVar20 = Args_4_00->Resources + uVar19;
        HashMapStringKey::HashMapStringKey
                  ((HashMapStringKey *)&AssignedSamplerName,pPVar20->Name,false);
        pVar28 = std::
                 _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                 ::equal_range((_Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                                *)&msg,(key_type *)&AssignedSamplerName);
        HashMapStringKey::Clear((HashMapStringKey *)&AssignedSamplerName);
        for (_Var15._M_cur =
                  (__node_type *)
                  pVar28.first.
                  super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
                  ._M_cur;
            (_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
             )_Var15._M_cur !=
            pVar28.second.
            super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
            ._M_cur.
            super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
            ; _Var15._M_cur = (__node_type *)((_Var15._M_cur)->super__Hash_node_base)._M_nxt) {
          if (*(SHADER_TYPE *)
               ((long)&((_Var15._M_cur)->
                       super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
                       ).
                       super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>_>
                       ._M_storage._M_storage + 0x10) == pPVar20->ShaderStages) {
            if ((_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
                 )_Var15._M_cur !=
                pVar28.second.
                super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
                ._M_cur.
                super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
               ) goto LAB_0040e903;
            break;
          }
        }
        GetShaderStagesString_abi_cxx11_
                  (&msg_3,(Diligent *)(ulong)pPVar20->ShaderStages,ShaderStages_03);
        FormatString<char[10],char_const*,char[4],std::__cxx11::string,char[120]>
                  (&AssignedSamplerName,(Diligent *)"Sampler \'",(char (*) [10])pPVar20,
                   (char **)"\' (",(char (*) [4])&msg_3,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ")\' is not assigned to any texture. All samplers should be assigned to textures when combined texture samplers are used."
                   ,(char (*) [120])Args_4_00);
        std::__cxx11::string::~string((string *)&msg_3);
        if (DebugMessageCallback != (undefined *)0x0) {
          (*(code *)DebugMessageCallback)(1,AssignedSamplerName._M_dataplus._M_p,0,0,0);
        }
        std::__cxx11::string::~string((string *)&AssignedSamplerName);
      }
LAB_0040e903:
      uVar14 = (ulong)Args_4_00->NumResources;
    }
    for (uVar19 = 0; uVar19 < Args_4_00->NumImmutableSamplers; uVar19 = uVar19 + 1) {
      pIVar21 = Args_4_00->ImmutableSamplers;
      HashMapStringKey::HashMapStringKey
                ((HashMapStringKey *)&AssignedSamplerName,pIVar21[uVar19].SamplerOrTextureName,false
                );
      pVar28 = std::
               _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
               ::equal_range(&AssignedImtblSamplers._M_h,(key_type *)&AssignedSamplerName);
      HashMapStringKey::Clear((HashMapStringKey *)&AssignedSamplerName);
      for (_Var15._M_cur =
                (__node_type *)
                pVar28.first.
                super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
                ._M_cur;
          (_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
           )_Var15._M_cur !=
          pVar28.second.
          super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
          ._M_cur.
          super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
          ; _Var15._M_cur = (__node_type *)((_Var15._M_cur)->super__Hash_node_base)._M_nxt) {
        if (*(SHADER_TYPE *)
             ((long)&((_Var15._M_cur)->
                     super__Hash_node_value<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
                     ).
                     super__Hash_node_value_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>_>
                     ._M_storage._M_storage + 0x10) == pIVar21[uVar19].ShaderStages) {
          if ((_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
               )_Var15._M_cur !=
              pVar28.second.
              super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
              ._M_cur.
              super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
             ) goto LAB_0040e9ef;
          break;
        }
      }
      GetShaderStagesString_abi_cxx11_
                (&msg_3,(Diligent *)(ulong)pIVar21[uVar19].ShaderStages,ShaderStages_04);
      FormatString<char[20],char_const*,char[4],std::__cxx11::string,char[152]>
                (&AssignedSamplerName,(Diligent *)"Immutable sampler \'",
                 (char (*) [20])&pIVar21[uVar19].SamplerOrTextureName,(char **)"\' (",
                 (char (*) [4])&msg_3,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ") is not assigned to any texture or sampler. All immutable samplers should be assigned to textures or samplers when combined texture samplers are used."
                 ,(char (*) [152])Args_4_00);
      std::__cxx11::string::~string((string *)&msg_3);
      if (DebugMessageCallback != (undefined *)0x0) {
        (*(code *)DebugMessageCallback)(1,AssignedSamplerName._M_dataplus._M_p,0,0,0);
      }
      std::__cxx11::string::~string((string *)&AssignedSamplerName);
LAB_0040e9ef:
    }
    std::
    _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
    ::~_Hashtable(&AssignedImtblSamplers._M_h);
    std::
    _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
    ::~_Hashtable((_Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                   *)&msg);
  }
  std::
  _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::ImmutableSamplerDesc_&>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
  ::~_Hashtable(&ImtblSamplers._M_h);
  std::
  _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_const_Diligent::PipelineResourceDesc_&>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
  ::~_Hashtable(&Resources._M_h);
  return;
}

Assistant:

void ValidatePipelineResourceSignatureDesc(const PipelineResourceSignatureDesc& Desc,
                                           const IRenderDevice*                 pDevice,
                                           RENDER_DEVICE_TYPE                   DeviceType) noexcept(false)
{
    const RenderDeviceInfo& DeviceInfo = pDevice != nullptr ?
        pDevice->GetDeviceInfo() :
        RenderDeviceInfo{DeviceType, Version{}, DeviceFeatures{DEVICE_FEATURE_STATE_ENABLED}};

    const DeviceFeatures& Features = DeviceInfo.Features;

    if (Desc.BindingIndex >= MAX_RESOURCE_SIGNATURES)
        LOG_PRS_ERROR_AND_THROW("Desc.BindingIndex (", Uint32{Desc.BindingIndex}, ") exceeds the maximum allowed value (", MAX_RESOURCE_SIGNATURES - 1, ").");

    if (Desc.NumResources > MAX_RESOURCES_IN_SIGNATURE)
        LOG_PRS_ERROR_AND_THROW("Desc.NumResources (", Uint32{Desc.NumResources}, ") exceeds the maximum allowed value (", MAX_RESOURCES_IN_SIGNATURE, ").");

    if (Desc.NumResources != 0 && Desc.Resources == nullptr)
        LOG_PRS_ERROR_AND_THROW("Desc.NumResources (", Uint32{Desc.NumResources}, ") is not zero, but Desc.Resources is null.");

    if (Desc.NumImmutableSamplers != 0 && Desc.ImmutableSamplers == nullptr)
        LOG_PRS_ERROR_AND_THROW("Desc.NumImmutableSamplers (", Uint32{Desc.NumImmutableSamplers}, ") is not zero, but Desc.ImmutableSamplers is null.");

    if (Desc.UseCombinedTextureSamplers && (Desc.CombinedSamplerSuffix == nullptr || Desc.CombinedSamplerSuffix[0] == '\0'))
        LOG_PRS_ERROR_AND_THROW("Desc.UseCombinedTextureSamplers is true, but Desc.CombinedSamplerSuffix is null or empty");


    // Hash map of all resources by name
    std::unordered_multimap<HashMapStringKey, const PipelineResourceDesc&> Resources;
    for (Uint32 i = 0; i < Desc.NumResources; ++i)
    {
        const PipelineResourceDesc& Res = Desc.Resources[i];

        if (Res.Name == nullptr)
            LOG_PRS_ERROR_AND_THROW("Desc.Resources[", i, "].Name must not be null.");

        if (Res.Name[0] == '\0')
            LOG_PRS_ERROR_AND_THROW("Desc.Resources[", i, "].Name must not be empty.");

        if (Res.ShaderStages == SHADER_TYPE_UNKNOWN)
            LOG_PRS_ERROR_AND_THROW("Desc.Resources[", i, "].ShaderStages must not be SHADER_TYPE_UNKNOWN.");

        if (Res.ArraySize == 0)
            LOG_PRS_ERROR_AND_THROW("Desc.Resources[", i, "].ArraySize must not be 0.");

        const auto res_range = Resources.equal_range(Res.Name);
        for (auto res_it = res_range.first; res_it != res_range.second; ++res_it)
        {
            if ((res_it->second.ShaderStages & Res.ShaderStages) != 0)
            {
                LOG_PRS_ERROR_AND_THROW("Multiple resources with name '", Res.Name,
                                        "' specify overlapping shader stages. There may be multiple resources with the same name in different shader stages, "
                                        "but the stages must not overlap.");
            }

            if (Features.SeparablePrograms == DEVICE_FEATURE_STATE_DISABLED)
            {
                VERIFY_EXPR(res_it->second.ShaderStages != SHADER_TYPE_UNKNOWN);
                LOG_PRS_ERROR_AND_THROW("This device does not support separable programs, but there are separate resources with the name '",
                                        Res.Name, "' in shader stages ",
                                        GetShaderStagesString(Res.ShaderStages), " and ",
                                        GetShaderStagesString(res_it->second.ShaderStages),
                                        ". When separable programs are not supported, every resource is always shared between all stages. "
                                        "Use distinct resource names for each stage or define a single resource for all stages.");
            }
        }

        PIPELINE_RESOURCE_FLAGS AllowedResourceFlags = GetValidPipelineResourceFlags(Res.ResourceType);
        if ((Res.Flags & ~AllowedResourceFlags) != 0)
        {
            LOG_PRS_ERROR_AND_THROW("Incorrect Desc.Resources[", i, "].Flags (", GetPipelineResourceFlagsString(Res.Flags),
                                    "). Only the following flags are valid for a ", GetShaderResourceTypeLiteralName(Res.ResourceType),
                                    ": ", GetPipelineResourceFlagsString(AllowedResourceFlags, false, ", "), ".");
        }

        if ((Res.Flags & PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER) != 0 && Features.FormattedBuffers == DEVICE_FEATURE_STATE_DISABLED)
        {
            LOG_PRS_ERROR_AND_THROW("Incorrect Desc.Resources[", i, "].Flags (FORMATTED_BUFFER). The flag can only be used if FormattedBuffers device feature is enabled.");
        }

        if ((Res.Flags & PIPELINE_RESOURCE_FLAG_RUNTIME_ARRAY) != 0 && Features.ShaderResourceRuntimeArrays == DEVICE_FEATURE_STATE_DISABLED)
        {
            LOG_PRS_ERROR_AND_THROW("Incorrect Desc.Resources[", i, "].Flags (RUNTIME_ARRAY). The flag can only be used if ShaderResourceRuntimeArrays device feature is enabled.");
        }

        if (Res.ResourceType == SHADER_RESOURCE_TYPE_ACCEL_STRUCT && Features.RayTracing == DEVICE_FEATURE_STATE_DISABLED)
        {
            LOG_PRS_ERROR_AND_THROW("Incorrect Desc.Resources[", i, "].ResourceType (ACCEL_STRUCT): ray tracing is not supported by device.");
        }

        if (Res.ResourceType == SHADER_RESOURCE_TYPE_INPUT_ATTACHMENT && Res.ShaderStages != SHADER_TYPE_PIXEL)
        {
            LOG_PRS_ERROR_AND_THROW("Desc.Resources[", i, "].ResourceType (INPUT_ATTACHMENT) is only supported in pixel shader but ShaderStages are ", GetShaderStagesString(Res.ShaderStages), ".");
        }

        if (DeviceInfo.IsD3DDevice() || DeviceInfo.IsMetalDevice())
        {
            if ((Res.Flags & PIPELINE_RESOURCE_FLAG_COMBINED_SAMPLER) != 0 && !Desc.UseCombinedTextureSamplers)
            {
                LOG_PRS_ERROR_AND_THROW("Desc.Resources[", i,
                                        "].Flags contain COMBINED_SAMPLER flag, but Desc.UseCombinedTextureSamplers is false. "
                                        "In Direct3D and Metal backends, COMBINED_SAMPLER flag may only be used when UseCombinedTextureSamplers is true.");
            }
        }

        if ((Res.Flags & PIPELINE_RESOURCE_FLAG_GENERAL_INPUT_ATTACHMENT) != 0 &&
            DeviceInfo.Type != RENDER_DEVICE_TYPE_UNDEFINED && // May be UNDEFINED for serialized signature
            !DeviceInfo.IsVulkanDevice())
        {
            LOG_PRS_ERROR_AND_THROW("Desc.Resources[", i, "].Flags contain GENERAL_INPUT_ATTACHMENT which is only valid in Vulkan");
        }

        Resources.emplace(Res.Name, Res);

        // NB: when creating immutable sampler array, we have to define the sampler as both resource and
        //     immutable sampler. The sampler will not be exposed as a shader variable though.
        //if (Res.ResourceType == SHADER_RESOURCE_TYPE_SAMPLER)
        //{
        //    if (FindImmutableSampler(Desc.ImmutableSamplers, Desc.NumImmutableSamplers, Res.ShaderStages, Res.Name,
        //                             Desc.UseCombinedTextureSamplers ? Desc.CombinedSamplerSuffix : nullptr) >= 0)
        //    {
        //        LOG_PRS_ERROR_AND_THROW("Sampler '", Res.Name, "' is defined as both shader resource and immutable sampler.");
        //    }
        //}
    }

    // Hash map of all immutable samplers by name
    std::unordered_multimap<HashMapStringKey, const ImmutableSamplerDesc&> ImtblSamplers;
    for (Uint32 i = 0; i < Desc.NumImmutableSamplers; ++i)
    {
        const ImmutableSamplerDesc& SamDesc = Desc.ImmutableSamplers[i];
        if (SamDesc.SamplerOrTextureName == nullptr)
            LOG_PRS_ERROR_AND_THROW("Desc.ImmutableSamplers[", i, "].SamplerOrTextureName must not be null.");

        if (SamDesc.SamplerOrTextureName[0] == '\0')
            LOG_PRS_ERROR_AND_THROW("Desc.ImmutableSamplers[", i, "].SamplerOrTextureName must not be empty.");

        if (SamDesc.ShaderStages == SHADER_TYPE_UNKNOWN)
            LOG_PRS_ERROR_AND_THROW("Desc.ImmutableSamplers[", i, "].ShaderStages must not be SHADER_TYPE_UNKNOWN.");

        const auto sam_range = ImtblSamplers.equal_range(SamDesc.SamplerOrTextureName);
        for (auto sam_it = sam_range.first; sam_it != sam_range.second; ++sam_it)
        {
            if ((sam_it->second.ShaderStages & SamDesc.ShaderStages) != 0)
            {
                LOG_PRS_ERROR_AND_THROW("Multiple immutable samplers with name '", SamDesc.SamplerOrTextureName,
                                        "' specify overlapping shader stages. There may be multiple immutable samplers with the same name in different shader stages, "
                                        "but the stages must not overlap.");
            }
            if (Features.SeparablePrograms == DEVICE_FEATURE_STATE_DISABLED)
            {
                VERIFY_EXPR(sam_it->second.ShaderStages != SHADER_TYPE_UNKNOWN);
                LOG_PRS_ERROR_AND_THROW("This device does not support separable programs, but there are separate immutable samplers with the name '",
                                        SamDesc.SamplerOrTextureName, "' in shader stages ",
                                        GetShaderStagesString(SamDesc.ShaderStages), " and ",
                                        GetShaderStagesString(sam_it->second.ShaderStages),
                                        ". When separable programs are not supported, every resource is always shared between all stages. "
                                        "Use distinct immutable sampler names for each stage or define a single sampler for all stages.");
            }
        }

        ImtblSamplers.emplace(SamDesc.SamplerOrTextureName, SamDesc);
    }

    if (Desc.UseCombinedTextureSamplers)
    {
        VERIFY_EXPR(Desc.CombinedSamplerSuffix != nullptr);

        // List of samplers assigned to some texture
        std::unordered_multimap<HashMapStringKey, SHADER_TYPE> AssignedSamplers;
        // List of immutable samplers assigned to some texture
        std::unordered_multimap<HashMapStringKey, SHADER_TYPE> AssignedImtblSamplers;
        for (Uint32 i = 0; i < Desc.NumResources; ++i)
        {
            const PipelineResourceDesc& Res = Desc.Resources[i];
            if (Res.ResourceType != SHADER_RESOURCE_TYPE_TEXTURE_SRV)
            {
                // Only texture SRVs can be combined with samplers
                continue;
            }

            {
                const String AssignedSamplerName = String{Res.Name} + Desc.CombinedSamplerSuffix;

                const auto sam_range = Resources.equal_range(AssignedSamplerName.c_str());
                for (auto sam_it = sam_range.first; sam_it != sam_range.second; ++sam_it)
                {
                    const PipelineResourceDesc& Sam = sam_it->second;
                    VERIFY_EXPR(AssignedSamplerName == Sam.Name);

                    if ((Sam.ShaderStages & Res.ShaderStages) != 0)
                    {
                        if (Sam.ResourceType != SHADER_RESOURCE_TYPE_SAMPLER)
                        {
                            LOG_PRS_ERROR_AND_THROW("Resource '", Sam.Name, "' combined with texture '", Res.Name, "' is not a sampler.");
                        }

                        if ((Sam.ShaderStages & Res.ShaderStages) != Res.ShaderStages)
                        {
                            LOG_PRS_ERROR_AND_THROW("Texture '", Res.Name, "' is defined for the following shader stages: ", GetShaderStagesString(Res.ShaderStages),
                                                    ", but sampler '", Sam.Name, "' assigned to it uses only some of these stages: ", GetShaderStagesString(Sam.ShaderStages),
                                                    ". A resource that is present in multiple shader stages can't be combined with different samplers in different stages. "
                                                    "Either use separate resources for different stages, or define the sampler for all stages that the resource uses.");
                        }

                        if (Sam.VarType != Res.VarType)
                        {
                            LOG_PRS_ERROR_AND_THROW("The type (", GetShaderVariableTypeLiteralName(Res.VarType), ") of texture resource '", Res.Name,
                                                    "' does not match the type (", GetShaderVariableTypeLiteralName(Sam.VarType),
                                                    ") of sampler '", Sam.Name, "' that is assigned to it.");
                        }

                        AssignedSamplers.emplace(Sam.Name, Sam.ShaderStages);

                        break;
                    }
                }
            }

            {
                const auto imtbl_sam_range = ImtblSamplers.equal_range(Res.Name);
                for (auto sam_it = imtbl_sam_range.first; sam_it != imtbl_sam_range.second; ++sam_it)
                {
                    const ImmutableSamplerDesc& Sam = sam_it->second;
                    VERIFY_EXPR(strcmp(Sam.SamplerOrTextureName, Res.Name) == 0);

                    if ((Sam.ShaderStages & Res.ShaderStages) != 0)
                    {
                        if ((Sam.ShaderStages & Res.ShaderStages) != Res.ShaderStages)
                        {
                            LOG_PRS_ERROR_AND_THROW("Texture '", Res.Name, "' is defined for the following shader stages: ", GetShaderStagesString(Res.ShaderStages),
                                                    ", but immutable sampler that is assigned to it uses only some of these stages: ", GetShaderStagesString(Sam.ShaderStages),
                                                    ". A resource that is present in multiple shader stages can't be combined with different immutable samples in different stages. "
                                                    "Either use separate resources for different stages, or define the immutable sampler for all stages that the resource uses.");
                        }

                        AssignedImtblSamplers.emplace(Sam.SamplerOrTextureName, Sam.ShaderStages);

                        break;
                    }
                }
            }
        }

        for (Uint32 i = 0; i < Desc.NumResources; ++i)
        {
            const PipelineResourceDesc& Res = Desc.Resources[i];
            if (Res.ResourceType != SHADER_RESOURCE_TYPE_SAMPLER)
                continue;

            auto assigned_sam_range = AssignedSamplers.equal_range(Res.Name);

            auto it = assigned_sam_range.first;
            while (it != assigned_sam_range.second)
            {
                if (it->second == Res.ShaderStages)
                    break;
                ++it;
            }
            if (it == assigned_sam_range.second)
            {
                LOG_WARNING_MESSAGE("Sampler '", Res.Name, "' (", GetShaderStagesString(Res.ShaderStages), ")' is not assigned to any texture. All samplers should be assigned to textures when combined texture samplers are used.");
            }
        }

        for (Uint32 i = 0; i < Desc.NumImmutableSamplers; ++i)
        {
            const ImmutableSamplerDesc& SamDesc = Desc.ImmutableSamplers[i];

            auto assigned_sam_range = AssignedImtblSamplers.equal_range(SamDesc.SamplerOrTextureName);

            auto it = assigned_sam_range.first;
            while (it != assigned_sam_range.second)
            {
                if (it->second == SamDesc.ShaderStages)
                    break;
                ++it;
            }
            if (it == assigned_sam_range.second)
            {
                LOG_WARNING_MESSAGE("Immutable sampler '", SamDesc.SamplerOrTextureName, "' (", GetShaderStagesString(SamDesc.ShaderStages), ") is not assigned to any texture or sampler. All immutable samplers should be assigned to textures or samplers when combined texture samplers are used.");
            }
        }
    }
}